

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O2

void CCEXP::AddTable<short>(CCEXP *obj,char *matname,char *typeName,size_t MaxRows)

{
  int iVar1;
  size_t sVar2;
  CCEXPBase *__p;
  uint line;
  char *msg;
  __shared_ptr<CCEXP::CCEXPBase,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  obj->ErrorId = 0;
  if (obj->isActive == true) {
    if (obj->Status == 1) {
      obj->Status = 2;
      sVar2 = CCEXP::checkDuplicatedNames(obj,matname);
      if (sVar2 == 0) {
        __p = (CCEXPBase *)operator_new(0xb8);
        __p->_vptr_CCEXPBase = (_func_int **)&PTR__CCEXPMat_00130ca8;
        *(undefined2 *)((long)&__p[0x11]._vptr_CCEXPBase + 2) = 0x100;
        __p[0x14]._vptr_CCEXPBase = (_func_int **)0x0;
        __p[0x12]._vptr_CCEXPBase = (_func_int **)0x0;
        __p[0x13]._vptr_CCEXPBase = (_func_int **)0x0;
        __p[0x15]._vptr_CCEXPBase = (_func_int **)0xffffffffffffffff;
        std::__shared_ptr<CCEXP::CCEXPBase,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<CCEXP::CCEXPBase,void>(local_40,__p);
        ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::push_back
                  (&obj->M,(shared_ptr<CCEXP::CCEXPBase> *)local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        iVar1 = CCEXPMat<short>::Initialize
                          ((CCEXPMat<short> *)
                           (obj->M).pdata[(obj->M).elements - 1].
                           super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           matname,typeName,MaxRows,obj);
        if (iVar1 == 0) {
          obj->Status = 1;
          return;
        }
        msg = "[%s]: AddTable():: Internal error occured during initialization()!";
        line = 0x1fb;
      }
      else {
        msg = "[%s]: AddTable()::  Table with name [%s] already exist!";
        line = 0x1f7;
      }
    }
    else {
      msg = "[%s]: AddTable():: CCEXP object has wrong status.";
      line = 500;
    }
    CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",line,msg,obj->SavingFile);
  }
  return;
}

Assistant:

inline void AddTable (
	CCEXP &obj,
	const char* matname,
	const char* typeName,
	size_t MaxRows = 0
) {
	obj.ErrorId = 0;
	if (!obj.isActive) return;
	CECS_ERR(CCEXPECS,obj.Status != CCEXPORTMAT_READY,"[%s]: AddTable():: CCEXP object has wrong status." , obj.SavingFile );
	obj.Status = CCEXPORTMAT_ACTIVE;
	size_t rd = obj.checkDuplicatedNames(matname);
	CECS_ERR(CCEXPECS,rd > 0,"[%s]: AddTable()::  Table with name [%s] already exist!", obj.SavingFile, matname);
	obj.M.push_back(shared_ptr<CCEXPBase>((CCEXPBase*) new CCEXPMat<T>));
	CCEXPMat<T>* U = static_cast<CCEXPMat<T>*>(obj.M[obj.M.size()-1].get());
	int ret = U->Initialize(matname, typeName, MaxRows, &obj);
	CECS_ERR(CCEXPECS,ret != 0,"[%s]: AddTable():: Internal error occured during initialization()!", obj.SavingFile);
	obj.Status = CCEXPORTMAT_READY;
}